

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

GCupval * func_finduv(lua_State *L,TValue *slot)

{
  uint64_t uVar1;
  GCupval *pGVar2;
  bool bVar3;
  GCupval *uv;
  GCupval *p;
  GCRef *pp;
  global_State *g;
  TValue *slot_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  p = (GCupval *)&L->openupval;
  while( true ) {
    bVar3 = false;
    if ((p->nextgc).gcptr64 != 0) {
      uv = (GCupval *)(p->nextgc).gcptr64;
      bVar3 = slot <= (TValue *)(uv->v).ptr64;
    }
    if (!bVar3) break;
    if ((TValue *)(uv->v).ptr64 == slot) {
      if ((uv->marked & (*(byte *)(uVar1 + 0x20) ^ 3) & 3) != 0) {
        uv->marked = uv->marked ^ 3;
      }
      return uv;
    }
    p = uv;
  }
  pGVar2 = (GCupval *)lj_mem_realloc(L,(void *)0x0,0,0x30);
  pGVar2->marked = *(byte *)(uVar1 + 0x20) & 3;
  pGVar2->gct = '\x05';
  pGVar2->closed = '\0';
  (pGVar2->v).ptr64 = (uint64_t)slot;
  (pGVar2->nextgc).gcptr64 = (p->nextgc).gcptr64;
  (p->nextgc).gcptr64 = (uint64_t)pGVar2;
  (pGVar2->field_5).tv = (TValue)(uVar1 + 0x118);
  (pGVar2->field_5).field_1.next.gcptr64 = *(uint64_t *)(uVar1 + 0x130);
  *(GCupval **)((pGVar2->field_5).field_1.next.gcptr64 + 0x10) = pGVar2;
  *(GCupval **)(uVar1 + 0x130) = pGVar2;
  return pGVar2;
}

Assistant:

static GCupval *func_finduv(lua_State *L, TValue *slot)
{
  global_State *g = G(L);
  GCRef *pp = &L->openupval;
  GCupval *p;
  GCupval *uv;
  /* Search the sorted list of open upvalues. */
  while (gcref(*pp) != NULL && uvval((p = gco2uv(gcref(*pp)))) >= slot) {
    lj_assertG(!p->closed && uvval(p) != &p->tv, "closed upvalue in chain");
    if (uvval(p) == slot) {  /* Found open upvalue pointing to same slot? */
      if (isdead(g, obj2gco(p)))  /* Resurrect it, if it's dead. */
	flipwhite(obj2gco(p));
      return p;
    }
    pp = &p->nextgc;
  }
  /* No matching upvalue found. Create a new one. */
  uv = lj_mem_newt(L, sizeof(GCupval), GCupval);
  newwhite(g, uv);
  uv->gct = ~LJ_TUPVAL;
  uv->closed = 0;  /* Still open. */
  setmref(uv->v, slot);  /* Pointing to the stack slot. */
  /* NOBARRIER: The GCupval is new (marked white) and open. */
  setgcrefr(uv->nextgc, *pp);  /* Insert into sorted list of open upvalues. */
  setgcref(*pp, obj2gco(uv));
  setgcref(uv->prev, obj2gco(&g->uvhead));  /* Insert into GC list, too. */
  setgcrefr(uv->next, g->uvhead.next);
  setgcref(uvnext(uv)->prev, obj2gco(uv));
  setgcref(g->uvhead.next, obj2gco(uv));
  lj_assertG(uvprev(uvnext(uv)) == uv && uvnext(uvprev(uv)) == uv,
	     "broken upvalue chain");
  return uv;
}